

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate_stream.cpp
# Opt level: O0

void boost::deflate::deflate_stream_test::testWrappedStream(void)

{
  anon_class_8_1_ba1d7388 local_48;
  anon_class_8_1_ba1d7388 test;
  allocator<char> local_29;
  undefined1 local_28 [8];
  string raw;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_28,"This is fake content",&local_29);
  std::allocator<char>::~allocator(&local_29);
  local_48.raw = (string *)local_28;
  testWrappedStream::anon_class_8_1_ba1d7388::operator()(&local_48,none);
  testWrappedStream::anon_class_8_1_ba1d7388::operator()(&local_48,zlib);
  testWrappedStream::anon_class_8_1_ba1d7388::operator()(&local_48,gzip);
  std::__cxx11::string::~string((string *)local_28);
  return;
}

Assistant:

static void testWrappedStream(){
        std::string raw = "This is fake content";
        auto test = [&](wrap wrap){
            std::string compr;
            compr.resize(raw.size());
            auto ds = deflate_stream();
            ds.reset(6, 15, 8, Strategy::normal, wrap);
            z_params zp{};
            zp.next_in = raw.c_str();
            zp.avail_in = raw.size();
            zp.next_out = &compr[0];
            zp.avail_out = compr.size();

            error_code ec;
            ds.write(zp, Flush::full, ec);
            BOOST_TEST(!ec);
            BOOST_TEST(decompress(compr) == raw);
        };
        test(boost::deflate::wrap::none);
        test(boost::deflate::wrap::zlib);
        test(boost::deflate::wrap::gzip);
    }